

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RtreeDValue cellMargin(Rtree *pRtree,RtreeCell *p)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  lVar1 = (ulong)pRtree->nDim2 + 2;
  dVar2 = 0.0;
  do {
    if (pRtree->eCoordType == '\0') {
      dVar3 = (double)p->aCoord[lVar1 + -3].f;
      dVar4 = (double)p->aCoord[lVar1 + -4].f;
    }
    else {
      dVar3 = (double)p->aCoord[lVar1 + -3].i;
      dVar4 = (double)p->aCoord[lVar1 + -4].i;
    }
    dVar2 = dVar2 + (dVar3 - dVar4);
    lVar1 = lVar1 + -2;
  } while (3 < lVar1);
  return dVar2;
}

Assistant:

static RtreeDValue cellMargin(Rtree *pRtree, RtreeCell *p){
  RtreeDValue margin = 0;
  int ii = pRtree->nDim2 - 2;
  do{
    margin += (DCOORD(p->aCoord[ii+1]) - DCOORD(p->aCoord[ii]));
    ii -= 2;
  }while( ii>=0 );
  return margin;
}